

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O0

void __thiscall OpenMD::ifstrstream::ifstrstream(ifstrstream *this)

{
  long *in_RDI;
  
  std::ios::ios((ios *)(in_RDI + 0x2e));
  std::istream::istream(in_RDI,(streambuf *)&PTR_construction_vtable_24__00503b88);
  *in_RDI = (long)&PTR__ifstrstream_00503b48;
  in_RDI[0x2e] = (long)&PTR__ifstrstream_00503b70;
  std::__cxx11::stringbuf::stringbuf((stringbuf *)(in_RDI + 2));
  std::filebuf::filebuf((filebuf *)(in_RDI + 0xf));
  *(undefined1 *)(in_RDI + 0x2d) = 0;
  std::ios::init((streambuf *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  return;
}

Assistant:

ifstrstream::ifstrstream() :
      std::basic_istream<char, std::char_traits<char>>(0), internalFileBuf_(),
      isRead(false) {
    this->init(&internalFileBuf_);
  }